

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalysis.cpp
# Opt level: O1

void __thiscall TPZAnalysis::Run(TPZAnalysis *this,ostream *out)

{
  int64_t iVar1;
  TPZSimpleTimer t;
  string local_b8;
  string local_98;
  TPZSimpleTimer local_78;
  
  iVar1 = TPZCompMesh::NEquations(this->fCompMesh);
  if (20000 < iVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Entering Assemble Equations\n",0x1c);
    std::ostream::flush();
  }
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Time for assembly","");
  TPZSimpleTimer::TPZSimpleTimer(&local_78,&local_98,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  (*(this->super_TPZSavable)._vptr_TPZSavable[9])(this);
  TPZSimpleTimer::~TPZSimpleTimer(&local_78);
  if (20000 < iVar1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Entering Solve\n",0xf)
    ;
    std::ostream::flush();
  }
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Time for solving","");
  TPZSimpleTimer::TPZSimpleTimer(&local_78,&local_b8,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  (*(this->super_TPZSavable)._vptr_TPZSavable[10])(this);
  TPZSimpleTimer::~TPZSimpleTimer(&local_78);
  return;
}

Assistant:

void TPZAnalysis::Run(std::ostream &out)
{
    int64_t neq = fCompMesh->NEquations();
    
    if(neq > 20000)
    {
        std::cout << "Entering Assemble Equations\n";
        std::cout.flush();
    }

    {
        TPZSimpleTimer t("Time for assembly");
        Assemble();
    }
    
    if(neq > 20000)
    {
        std::cout << "Entering Solve\n";
        std::cout.flush();
    }
    
    {
        TPZSimpleTimer t("Time for solving");
        Solve();
    }
}